

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setIntParam(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,IntParam param,int value,bool init)

{
  SPxLPRational *pSVar1;
  uint uVar2;
  int iVar3;
  SPxSense SVar4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  byte in_CL;
  uint in_EDX;
  IntParam in_ESI;
  undefined8 uVar6;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined4 in_stack_ffffffffffffff18;
  TYPE in_stack_ffffffffffffff1c;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff34;
  undefined1 destroy;
  SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff38;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff50;
  bool destroy_00;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff58;
  undefined1 *puVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff60;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  undefined1 local_68 [32];
  undefined1 local_48 [20];
  Verbosity local_34 [6];
  byte local_19;
  uint local_18;
  IntParam local_14;
  
  destroy = (undefined1)((uint)in_stack_ffffffffffffff34 >> 0x18);
  local_19 = in_CL & 1;
  local_18 = in_EDX;
  local_14 = in_ESI;
  if ((local_19 == 0) && (uVar2 = intParam(in_RDI,in_ESI), in_EDX == uVar2)) {
    return true;
  }
  if ((*(int *)(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ::Settings::intParam + (ulong)local_14 * 4 + 0x770) <= (int)local_18) &&
     ((int)local_18 <=
      *(int *)(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::Settings::intParam + (ulong)local_14 * 4 + 0x7e0))) {
    destroy_00 = SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0);
    switch(local_14) {
    case OBJSENSE:
      if ((local_18 != 1) && (local_18 != 0xffffffff)) {
        return false;
      }
      uVar6 = 0xffffffff;
      if (local_18 == 1) {
        uVar6 = 1;
      }
      (*(in_RDI->_realLP->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x45])(in_RDI->_realLP,uVar6);
      if (in_RDI->_rationalLP != (SPxLPRational *)0x0) {
        uVar6 = 0xffffffff;
        if (local_18 == 1) {
          uVar6 = 1;
        }
        (*(in_RDI->_rationalLP->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._vptr_ClassArray[0x45])(in_RDI->_rationalLP,uVar6);
      }
      _invalidateSolution(in_stack_ffffffffffffff20);
      break;
    case REPRESENTATION:
      if (((local_18 != 1) && (local_18 != 2)) && (local_18 != 0)) {
        return false;
      }
      break;
    case ALGORITHM:
      break;
    case FACTOR_UPDATE_TYPE:
      if ((local_18 != 0) && (local_18 != 1)) {
        return false;
      }
      SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setUtype(&in_RDI->_slufactor,(uint)(local_18 != 0));
      break;
    case FACTOR_UPDATE_MAX:
      if (local_18 == 0) {
        pSVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::basis(&in_RDI->_solver);
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setMaxUpdates(pSVar5,200);
      }
      else {
        pSVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::basis(&in_RDI->_solver);
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setMaxUpdates(pSVar5,local_18);
      }
      break;
    case ITERLIMIT:
      break;
    case REFLIMIT:
      break;
    case STALLREFLIMIT:
      break;
    case DISPLAYFREQ:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setDisplayFreq(&in_RDI->_solver,local_18);
      break;
    case VERBOSITY:
      switch(local_18) {
      case 0:
        local_34[5] = 0;
        SPxOut::setVerbosity(&in_RDI->spxout,local_34 + 5);
        break;
      case 1:
        local_34[4] = 1;
        SPxOut::setVerbosity(&in_RDI->spxout,local_34 + 4);
        break;
      case 2:
        local_34[3] = 2;
        SPxOut::setVerbosity(&in_RDI->spxout,local_34 + 3);
        break;
      case 3:
        local_34[2] = 3;
        SPxOut::setVerbosity(&in_RDI->spxout,local_34 + 2);
        break;
      case 4:
        local_34[1] = 4;
        SPxOut::setVerbosity(&in_RDI->spxout,local_34 + 1);
        break;
      case 5:
        local_34[0] = INFO3;
        SPxOut::setVerbosity(&in_RDI->spxout,local_34);
      }
      break;
    case SIMPLIFIER:
      in_RDI->_boostedSimplifier =
           (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      switch(local_18) {
      case 0:
        in_RDI->_simplifier =
             (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
        break;
      case 1:
      case 3:
        in_RDI->_simplifier =
             &(in_RDI->_simplifierMainSM).
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      case 2:
        in_RDI->_simplifier =
             &(in_RDI->_simplifierMainSM).
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        return false;
      default:
        return false;
      }
      if (in_RDI->_simplifier !=
          (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        pSVar9 = in_RDI->_simplifier;
        std::shared_ptr<soplex::Tolerances>::shared_ptr
                  ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff20,
                   (shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        (*pSVar9->_vptr_SPxSimplifier[0x14])(pSVar9,local_48);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a36ae)
        ;
      }
      if (in_RDI->_boostedSimplifier !=
          (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        pSVar7 = in_RDI->_boostedSimplifier;
        puVar8 = local_68;
        std::shared_ptr<soplex::Tolerances>::shared_ptr
                  ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff20,
                   (shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        (*pSVar7->_vptr_SPxSimplifier[0x14])(pSVar7,puVar8);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a3731)
        ;
      }
      break;
    case SCALER:
      in_RDI->_boostedScaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      switch(local_18) {
      case 0:
        in_RDI->_scaler =
             (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
        break;
      case 1:
        in_RDI->_scaler =
             &(in_RDI->_scalerUniequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      case 2:
        in_RDI->_scaler =
             &(in_RDI->_scalerBiequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      case 3:
        in_RDI->_scaler =
             &(in_RDI->_scalerGeo1).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      case 4:
        in_RDI->_scaler =
             &(in_RDI->_scalerGeo8).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      case 5:
        in_RDI->_scaler =
             &(in_RDI->_scalerLeastsq).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      case 6:
        in_RDI->_scaler =
             &(in_RDI->_scalerGeoequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      default:
        return false;
      }
      if (in_RDI->_scaler !=
          (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        (*in_RDI->_scaler->_vptr_SPxScaler[0xc])(in_RDI->_scaler,&in_RDI->_tolerances);
      }
      if (in_RDI->_boostedScaler !=
          (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        (*in_RDI->_boostedScaler->_vptr_SPxScaler[0xc])(in_RDI->_boostedScaler,&in_RDI->_tolerances)
        ;
      }
      break;
    case STARTER:
      this_00 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(ulong)local_18;
      switch(this_00) {
      case (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0:
        in_RDI->_starter =
             (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
        break;
      case (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x1:
        in_RDI->_starter =
             &(in_RDI->_starterWeight).
              super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        break;
      case (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x2:
        in_RDI->_starter =
             (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&in_RDI->_starterSum;
        break;
      case (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x3:
        in_RDI->_starter =
             (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&in_RDI->_starterVector;
        break;
      default:
        return false;
      }
      if (in_RDI->_starter !=
          (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        (*in_RDI->_starter->_vptr_SPxStarter[5])(in_RDI->_starter,&in_RDI->_tolerances);
      }
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setStarter(this_00,in_stack_ffffffffffffff38,(bool)destroy);
      break;
    case PRICER:
      switch(local_18) {
      case 0:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setPricer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,destroy_00);
        break;
      case 1:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setPricer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,destroy_00);
        break;
      case 2:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setPricer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,destroy_00);
        break;
      case 3:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setPricer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,destroy_00);
        break;
      case 4:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setPricer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,destroy_00);
        break;
      case 5:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setPricer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,destroy_00);
        break;
      default:
        return false;
      }
      break;
    case RATIOTESTER:
      switch(local_18) {
      case 0:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setTester(in_stack_ffffffffffffff60,
                    (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff58,destroy_00);
        break;
      case 1:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setTester(in_stack_ffffffffffffff60,
                    (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff58,destroy_00);
        break;
      case 2:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setTester(in_stack_ffffffffffffff60,
                    (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff58,destroy_00);
        break;
      case 3:
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setTester(in_stack_ffffffffffffff60,
                    (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff58,destroy_00);
        break;
      default:
        return false;
      }
      break;
    case SYNCMODE:
      if (local_18 == 0) {
        if (in_RDI->_rationalLP != (SPxLPRational *)0x0) {
          (**(in_RDI->_rationalLP->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .
             super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._vptr_ClassArray)();
          spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
                    ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      **)0x4a3aca);
        }
      }
      else if (local_18 == 1) {
        iVar3 = intParam(in_RDI,local_14);
        if (iVar3 == 0) {
          _syncLPRational(in_stack_ffffffffffffff20,SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
        }
      }
      else {
        if (local_18 != 2) {
          return false;
        }
        _ensureRationalLP(in_stack_ffffffffffffff50);
        pSVar1 = in_RDI->_rationalLP;
        SVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::spxSense(in_RDI->_realLP);
        uVar6 = 1;
        if (SVar4 == MINIMIZE) {
          uVar6 = 0xffffffff;
        }
        (*(pSVar1->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._vptr_ClassArray[0x45])(pSVar1,uVar6);
      }
      break;
    case READMODE:
      if (1 < local_18) {
        return false;
      }
      break;
    case SOLVEMODE:
      if (2 < local_18) {
        return false;
      }
      break;
    case CHECKMODE:
      if (2 < local_18) {
        return false;
      }
      break;
    case TIMER:
      if (local_18 == 0) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setTiming((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff20,OFF);
      }
      else if (local_18 == 1) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setTiming((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff20,USER_TIME);
      }
      else {
        if (local_18 != 2) {
          return false;
        }
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setTiming((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff20,WALLCLOCK_TIME);
      }
      break;
    case HYPER_PRICING:
      if (2 < local_18) {
        return false;
      }
      break;
    case RATFAC_MINSTALLS:
      break;
    case LEASTSQ_MAXROUNDS:
      if (in_RDI->_scaler !=
          (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        (*in_RDI->_scaler->_vptr_SPxScaler[0xb])(in_RDI->_scaler,(ulong)local_18,"intparam");
      }
      break;
    case SOLUTION_POLISHING:
      if (local_18 == 0) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setSolutionPolishing(&in_RDI->_solver,POLISH_OFF);
      }
      else if (local_18 == 1) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setSolutionPolishing(&in_RDI->_solver,POLISH_INTEGRALITY);
      }
      else {
        if (local_18 != 2) {
          return false;
        }
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setSolutionPolishing(&in_RDI->_solver,POLISH_FRACTIONALITY);
      }
      break;
    case PRINTBASISMETRIC:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setMetricInformation(&in_RDI->_solver,local_18);
      break;
    case STATTIMER:
      setTimings(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      break;
    case MULTIPRECISION_LIMIT:
      break;
    case STORE_BASIS_SIMPLEX_FREQ:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setStoreBasisFreqForBoosting(&in_RDI->_solver,local_18);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setStoreBasisFreqForBoosting(&in_RDI->_boostedSolver,local_18);
      break;
    default:
      return false;
    }
    in_RDI->_currentSettings->_intParamValues[local_14] = local_18;
    return true;
  }
  return false;
}

Assistant:

bool SoPlexBase<R>::setIntParam(const IntParam param, const int value, const bool init)
{
   assert(param >= 0);
   assert(param < INTPARAM_COUNT);
   assert(init || _isConsistent());

   if(!init && value == intParam(param))
      return true;

   // check for a valid parameter value wrt bounds
   if(value < _currentSettings->intParam.lower[param]
         || value > _currentSettings->intParam.upper[param])
      return false;

   switch(param)
   {
   // objective sense
   case SoPlexBase<R>::OBJSENSE:
      if(value != SoPlexBase<R>::OBJSENSE_MAXIMIZE && value != SoPlexBase<R>::OBJSENSE_MINIMIZE)
         return false;

      _realLP->changeSense(value == SoPlexBase<R>::OBJSENSE_MAXIMIZE ? SPxLPBase<R>::MAXIMIZE :
                           SPxLPBase<R>::MINIMIZE);

      if(_rationalLP != nullptr)
         _rationalLP->changeSense(value == SoPlexBase<R>::OBJSENSE_MAXIMIZE ? SPxLPRational::MAXIMIZE :
                                  SPxLPRational::MINIMIZE);

      _invalidateSolution();
      break;

   // type of computational form, i.e., column or row representation
   case SoPlexBase<R>::REPRESENTATION:
      if(value != SoPlexBase<R>::REPRESENTATION_COLUMN && value != SoPlexBase<R>::REPRESENTATION_ROW
            && value != SoPlexBase<R>::REPRESENTATION_AUTO)
         return false;

      break;

   // type of algorithm, i.e., primal or dual
   case SoPlexBase<R>::ALGORITHM:
      // decide upon entering/leaving at solve time depending on representation
      break;

   // type of LU update
   case SoPlexBase<R>::FACTOR_UPDATE_TYPE:
      if(value != SoPlexBase<R>::FACTOR_UPDATE_TYPE_ETA && value != SoPlexBase<R>::FACTOR_UPDATE_TYPE_FT)
         return false;

      _slufactor.setUtype(value == SoPlexBase<R>::FACTOR_UPDATE_TYPE_ETA ? SLUFactor<R>::ETA :
                          SLUFactor<R>::FOREST_TOMLIN);
      break;

   // maximum number of updates before fresh factorization
   case SoPlexBase<R>::FACTOR_UPDATE_MAX:
      if(value == 0)
         _solver.basis().setMaxUpdates(SOPLEX_REFACTOR_INTERVAL);
      else
         _solver.basis().setMaxUpdates(value);

      break;

   // iteration limit (-1 if unlimited)
   case SoPlexBase<R>::ITERLIMIT:
      break;

   // refinement limit (-1 if unlimited)
   case SoPlexBase<R>::REFLIMIT:
      break;

   // stalling refinement limit (-1 if unlimited)
   case SoPlexBase<R>::STALLREFLIMIT:
      break;

   // display frequency
   case SoPlexBase<R>::DISPLAYFREQ:
      _solver.setDisplayFreq(value);
      break;

   // verbosity level
   case SoPlexBase<R>::VERBOSITY:
      switch(value)
      {
      case 0:
         spxout.setVerbosity(SPxOut::ERROR);
         break;

      case 1:
         spxout.setVerbosity(SPxOut::WARNING);
         break;

      case 2:
         spxout.setVerbosity(SPxOut::DEBUG);
         break;

      case 3:
         spxout.setVerbosity(SPxOut::INFO1);
         break;

      case 4:
         spxout.setVerbosity(SPxOut::INFO2);
         break;

      case 5:
         spxout.setVerbosity(SPxOut::INFO3);
         break;
      }

      break;

   // type of simplifier
   case SoPlexBase<R>::SIMPLIFIER:
#ifndef SOPLEX_WITH_MPFR
      _boostedSimplifier = nullptr;
#endif

      switch(value)
      {
      case SIMPLIFIER_OFF:
         _simplifier = nullptr;
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = nullptr;
#endif
         break;

      case SIMPLIFIER_INTERNAL:
      case SIMPLIFIER_AUTO:
         _simplifier = &_simplifierMainSM;
         assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = &_boostedSimplifierMainSM;
         assert(_boostedSimplifier != nullptr);
#endif
         break;

      case SIMPLIFIER_PAPILO:
#ifdef SOPLEX_WITH_PAPILO
         _simplifier = &_simplifierPaPILO;
         assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = &_boostedSimplifierPaPILO;
         assert(_boostedSimplifier != nullptr);
#endif
         break;
#else
         _simplifier = &_simplifierMainSM;
         assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
         _boostedSimplifier = &_boostedSimplifierMainSM;
         assert(_boostedSimplifier != nullptr);
#endif
         return false;
#endif

      default:
         return false;
      }

      if(_simplifier != nullptr)
         _simplifier->setTolerances(this->_tolerances);

      if(_boostedSimplifier != nullptr)
         _boostedSimplifier->setTolerances(this->_tolerances);

      break;

   // type of scaler
   case SoPlexBase<R>::SCALER:
#ifndef SOPLEX_WITH_MPFR
      _boostedScaler = nullptr;
#endif

      switch(value)
      {
      case SCALER_OFF:
         _scaler = nullptr;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = nullptr;
#endif
         break;

      case SCALER_UNIEQUI:
         _scaler = &_scalerUniequi;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerUniequi;
#endif
         break;

      case SCALER_BIEQUI:
         _scaler = &_scalerBiequi;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerBiequi;
#endif
         break;

      case SCALER_GEO1:
         _scaler = &_scalerGeo1;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerGeo1;
#endif
         break;

      case SCALER_GEO8:
         _scaler = &_scalerGeo8;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerGeo8;
#endif
         break;

      case SCALER_LEASTSQ:
         _scaler = &_scalerLeastsq;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerLeastsq;
#endif
         break;

      case SCALER_GEOEQUI:
         _scaler = &_scalerGeoequi;
#ifdef SOPLEX_WITH_MPFR
         _boostedScaler = &_boostedScalerGeoequi;
#endif
         break;

      default:
         return false;
      }

      if(_scaler != nullptr)
         _scaler->setTolerances(this->_tolerances);

      if(_boostedScaler != nullptr)
         _boostedScaler->setTolerances(this->_tolerances);

      break;

   // type of starter used to create crash basis
   case SoPlexBase<R>::STARTER:
      switch(value)
      {
      case STARTER_OFF:
         _starter = nullptr;
         break;

      case STARTER_WEIGHT:
         _starter = &_starterWeight;
         break;

      case STARTER_SUM:
         _starter = &_starterSum;
         break;

      case STARTER_VECTOR:
         _starter = &_starterVector;
         break;

      default:
         return false;
      }

      if(_starter != nullptr)
         _starter->setTolerances(this->_tolerances);

      _solver.setStarter(_starter, false);
      break;

   // type of pricer
   case SoPlexBase<R>::PRICER:
      switch(value)
      {
      case PRICER_AUTO:
         _solver.setPricer(&_pricerAuto);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerAuto);
#endif
         break;

      case PRICER_DANTZIG:
         _solver.setPricer(&_pricerDantzig);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerDantzig);
#endif
         break;

      case PRICER_PARMULT:
         _solver.setPricer(&_pricerParMult);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerParMult);
#endif
         break;

      case PRICER_DEVEX:
         _solver.setPricer(&_pricerDevex);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerDevex);
#endif
         break;

      case PRICER_QUICKSTEEP:
         _solver.setPricer(&_pricerQuickSteep);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerQuickSteep);
#endif
         break;

      case PRICER_STEEP:
         _solver.setPricer(&_pricerSteep);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setPricer(&_boostedPricerSteep);
#endif
         break;

      default:
         return false;
      }

      break;

   // mode for synchronizing real and rational LP
   case SoPlexBase<R>::SYNCMODE:
      switch(value)
      {
      case SYNCMODE_ONLYREAL:
         if(_rationalLP != nullptr)
         {
            _rationalLP->~SPxLPRational();
            spx_free(_rationalLP);
         }

         break;

      case SYNCMODE_AUTO:
         if(intParam(param) == SYNCMODE_ONLYREAL)
            _syncLPRational();

         break;

      case SYNCMODE_MANUAL:
         _ensureRationalLP();
         assert(_realLP != nullptr);
         _rationalLP->changeSense(_realLP->spxSense() == SPxLPBase<R>::MINIMIZE ? SPxLPRational::MINIMIZE :
                                  SPxLPRational::MAXIMIZE);
         break;

      default:
         return false;
      }

      break;

   // mode for reading LP files; nothing to do but change the value if valid
   case SoPlexBase<R>::READMODE:
      switch(value)
      {
#ifndef SOPLEX_WITH_BOOST

      case READMODE_REAL:
         break;

      case READMODE_RATIONAL:
         SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
         return false;
#else

      case READMODE_REAL:
      case READMODE_RATIONAL:
         break;
#endif

      default:
         return false;
      }

      break;

   // mode for iterative refinement strategy; nothing to do but change the value if valid
   case SoPlexBase<R>::SOLVEMODE:
      switch(value)
      {
#ifndef SOPLEX_WITH_BOOST

      case SOLVEMODE_REAL:
      case SOLVEMODE_AUTO:
         break;

      case SOLVEMODE_RATIONAL:
         SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
         return false;
#else

      case SOLVEMODE_REAL:
      case SOLVEMODE_AUTO:
      case SOLVEMODE_RATIONAL:

         break;
#endif

      default:
         return false;
      }

      break;

   // mode for a posteriori feasibility checks; nothing to do but change the value if valid
   case SoPlexBase<R>::CHECKMODE:
      switch(value)
      {
      case CHECKMODE_REAL:
      case CHECKMODE_AUTO:
      case CHECKMODE_RATIONAL:
         break;

      default:
         return false;
      }

      break;

   // type of ratio test
   case SoPlexBase<R>::RATIOTESTER:
      switch(value)
      {
      case RATIOTESTER_TEXTBOOK:
         _solver.setTester(&_ratiotesterTextbook);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterTextbook);
#endif
         break;

      case RATIOTESTER_HARRIS:
         _solver.setTester(&_ratiotesterHarris);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterHarris);
#endif
         break;

      case RATIOTESTER_FAST:
         _solver.setTester(&_ratiotesterFast);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterFast);
#endif
         break;

      case RATIOTESTER_BOUNDFLIPPING:
         _solver.setTester(&_ratiotesterBoundFlipping);
#ifdef SOPLEX_WITH_MPFR
         _boostedSolver.setTester(&_boostedRatiotesterBoundFlipping);
#endif
         break;

      default:
         return false;
      }

      break;

   // type of timer
   case SoPlexBase<R>::TIMER:
      switch(value)
      {
      case TIMER_OFF:
         _solver.setTiming(Timer::OFF);
         break;

      case TIMER_CPU:
         _solver.setTiming(Timer::USER_TIME);
         break;

      case TIMER_WALLCLOCK:
         _solver.setTiming(Timer::WALLCLOCK_TIME);
         break;

      default:
         return false;
      }

      break;

   // mode of hyper pricing
   case SoPlexBase<R>::HYPER_PRICING:
      switch(value)
      {
      case HYPER_PRICING_OFF:
      case HYPER_PRICING_AUTO:
      case HYPER_PRICING_ON:
         break;

      default:
         return false;
      }

      break;

   // minimum number of stalling refinements since last pivot to trigger rational factorization
   case SoPlexBase<R>::RATFAC_MINSTALLS:
      break;

   // maximum number of conjugate gradient iterations in least square scaling
   case SoPlexBase<R>::LEASTSQ_MAXROUNDS:
      if(_scaler)
         _scaler->setIntParam(value);

      break;

   // mode of solution polishing
   case SoPlexBase<R>::SOLUTION_POLISHING:
      switch(value)
      {
      case POLISHING_OFF:
         _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
         break;

      case POLISHING_INTEGRALITY:
         _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_INTEGRALITY);
         break;

      case POLISHING_FRACTIONALITY:
         _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_FRACTIONALITY);
         break;

      default:
         return false;
      }

      break;

   // printing of condition n
   case PRINTBASISMETRIC:
      _solver.setMetricInformation(value);
      break;

   case STATTIMER:
      setTimings((Timer::TYPE) value);
      break;

   // maximum number of digits for the multiprecision type
   case SoPlexBase<R>::MULTIPRECISION_LIMIT:
      break;

   case SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ:
      // attributes in solvers need to be updated
      _solver.setStoreBasisFreqForBoosting(value);
      _boostedSolver.setStoreBasisFreqForBoosting(value);
      break;

   default:
      return false;
   }

   _currentSettings->_intParamValues[param] = value;
   return true;
}